

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

void send_recv_start(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uv_handle_type uVar4;
  uv_loop_t *loop;
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long *plVar11;
  test_ctx *ptVar12;
  undefined1 auVar13 [16];
  int64_t eval_b;
  int64_t eval_a;
  long lStack_4c0;
  test_ctx *ptStack_4b8;
  long alStack_4a8 [2];
  undefined1 auStack_498 [16];
  undefined8 *puStack_488;
  undefined8 uStack_408;
  undefined1 auStack_400 [8];
  undefined8 uStack_3f8;
  long lStack_3f0;
  long lStack_3e8;
  undefined1 auStack_3e0 [8];
  uv_process_t uStack_3d8;
  code *pcStack_370;
  undefined8 uStack_368;
  long lStack_360;
  undefined1 auStack_358 [800];
  undefined8 uStack_38;
  long lStack_30;
  long lStack_28;
  
  iVar2 = uv_is_readable(0x36bc90);
  if (iVar2 == 1) {
    iVar2 = uv_is_writable(0x36bc90);
    if (iVar2 != 1) goto LAB_001a8925;
    iVar2 = uv_is_closing(0x36bc90);
    if (iVar2 != 0) goto LAB_001a8934;
    iVar2 = uv_read_start(0x36bc90,alloc_cb,read_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    send_recv_start_cold_1();
LAB_001a8925:
    send_recv_start_cold_2();
LAB_001a8934:
    send_recv_start_cold_3();
  }
  send_recv_start_cold_4();
  uStack_38._0_4_ = 0x1a895c;
  uStack_38._4_4_ = 0;
  loop = (uv_loop_t *)uv_default_loop();
  uStack_38._0_4_ = 0x1a8968;
  uStack_38._4_4_ = 0;
  run_ipc_send_recv_helper(loop,0);
  lStack_28 = 0;
  lStack_30 = 0;
  uStack_38._0_4_ = 0x1a8981;
  uStack_38._4_4_ = 0;
  uVar5 = uv_default_loop();
  uStack_38._0_4_ = 0x1a8995;
  uStack_38._4_4_ = 0;
  uv_walk(uVar5,close_walk_cb,0);
  uStack_38._0_4_ = 0x1a899f;
  uStack_38._4_4_ = 0;
  uv_run(uVar5,0);
  lStack_28 = 0;
  uStack_38._0_4_ = 0x1a89ad;
  uStack_38._4_4_ = 0;
  uVar6 = uv_default_loop();
  uStack_38._0_4_ = 0x1a89b5;
  uStack_38._4_4_ = 0;
  iVar2 = uv_loop_close(uVar6);
  lStack_30 = (long)iVar2;
  if (lStack_28 == lStack_30) {
    uStack_38._0_4_ = 0x1a89cb;
    uStack_38._4_4_ = 0;
    uv_library_shutdown();
    return;
  }
  uStack_38 = ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_2();
  pcStack_370 = (code *)0x1a89fe;
  iVar2 = uv_loop_init(auStack_358);
  lStack_360 = (long)iVar2;
  uStack_368 = 0;
  if (lStack_360 == 0) {
    pcStack_370 = (code *)0x1a8a27;
    run_ipc_send_recv_helper((uv_loop_t *)auStack_358,1);
    lStack_360 = 0;
    uStack_368 = 0;
    pcStack_370 = (code *)0x1a8a47;
    iVar2 = uv_loop_close(auStack_358);
    lStack_360 = (long)iVar2;
    uStack_368 = 0;
    if (lStack_360 == 0) {
      return;
    }
  }
  else {
    pcStack_370 = (code *)0x1a8a76;
    ipc_send_recv_helper_threadproc_cold_1();
    pcStack_370 = (code *)0x1a8a83;
    ipc_send_recv_helper_threadproc_cold_2();
  }
  iVar2 = (int)&lStack_360;
  pcStack_370 = run_test;
  ipc_send_recv_helper_threadproc_cold_3();
  plVar11 = &lStack_3f0;
  pcStack_370 = (code *)uVar5;
  if (iVar2 == 0) {
    uStack_3f8 = (code *)0x1a8b52;
    spawn_helper(&ctx.channel,&uStack_3d8,"ipc_send_recv_helper");
    uStack_3f8 = (code *)0x1a8b60;
    connect_cb(&ctx.connect_req,0);
LAB_001a8b60:
    uStack_3f8 = (code *)0x1a8b65;
    uVar5 = uv_default_loop();
    uStack_3f8 = (code *)0x1a8b6f;
    iVar3 = uv_run(uVar5,0);
    lStack_3f0 = (long)iVar3;
    lStack_3e8 = 0;
    if (lStack_3f0 != 0) {
      uStack_3f8 = (code *)0x1a8be6;
      run_test_cold_3();
LAB_001a8be6:
      uStack_3f8 = (code *)0x1a8bf3;
      run_test_cold_4();
LAB_001a8bf3:
      uStack_3f8 = (code *)0x1a8c00;
      run_test_cold_1();
      goto LAB_001a8c00;
    }
    lStack_3f0 = 2;
    lStack_3e8 = (long)recv_cb_count;
    if (lStack_3e8 != 2) goto LAB_001a8be6;
    if (iVar2 == 0) {
      return;
    }
    uStack_3f8 = (code *)0x1a8bb6;
    iVar2 = uv_thread_join(auStack_3e0);
    lStack_3f0 = (long)iVar2;
    lStack_3e8 = 0;
    if (lStack_3f0 == 0) {
      return;
    }
  }
  else {
    uStack_3f8 = (code *)0x1a8ab8;
    iVar3 = uv_thread_create(auStack_3e0,ipc_send_recv_helper_threadproc,0x2a);
    uStack_3d8.data = (void *)(long)iVar3;
    lStack_3f0 = 0;
    if (uStack_3d8.data != (void *)0x0) goto LAB_001a8bf3;
    uStack_3f8 = (code *)0x1a8ae0;
    uv_sleep(1000);
    uStack_3f8 = (code *)0x1a8ae5;
    uVar5 = uv_default_loop();
    uStack_3f8 = (code *)0x1a8af9;
    iVar3 = uv_pipe_init(uVar5,&ctx,1);
    uStack_3d8.data = (void *)(long)iVar3;
    lStack_3f0 = 0;
    if (uStack_3d8.data == (void *)0x0) {
      uStack_3f8 = (code *)0x1a8b38;
      uv_pipe_connect(0x36c228,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_001a8b60;
    }
LAB_001a8c00:
    uStack_3f8 = (code *)0x1a8c0d;
    run_test_cold_2();
  }
  iVar2 = (int)&lStack_3e8;
  uStack_3f8 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)plVar11 == &ctx.connect_req) {
    auStack_400 = (undefined1  [8])(long)iVar2;
    if (auStack_400 != (undefined1  [8])0x0) goto LAB_001a8d4f;
    _auStack_400 = uv_buf_init(".",1);
    iVar2 = uv_write2(0x36c290,&ctx,auStack_400,1,0x36c428,0);
    uStack_408 = 0;
    if (iVar2 != 0) goto LAB_001a8d5e;
    auVar13 = uv_buf_init(".",1);
    _auStack_400 = auVar13;
    iVar2 = uv_write2(0x36c358,&ctx,auStack_400,1,0x36c540,0);
    uStack_408 = 0;
    if (iVar2 != 0) goto LAB_001a8d6d;
    iVar2 = uv_read_start(&ctx,alloc_cb,recv_cb);
    uStack_408 = 0;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001a8d4f:
    connect_cb_cold_2();
LAB_001a8d5e:
    connect_cb_cold_3();
LAB_001a8d6d:
    connect_cb_cold_4();
  }
  puVar8 = &uStack_408;
  connect_cb_cold_5();
  extraout_RDX[1] = 8;
  ptVar12 = (test_ctx *)0x8;
  pvVar7 = malloc(8);
  *extraout_RDX = pvVar7;
  if (pvVar7 != (void *)0x0) {
    return;
  }
  alloc_cb_cold_1();
  puVar9 = puVar8;
  free((void *)*extraout_RDX_00);
  if (ptVar12 == &ctx) {
    while( true ) {
      lVar1 = (long)recv_cb_count + 1;
      uVar5 = 0x36c770;
      if ((long)recv_cb_count == 0) {
        uVar5 = 0x36c658;
      }
      recv_cb_count = (int)lVar1;
      if (puVar8 != (undefined8 *)0xfffffffffffff001) break;
      if (lVar1 != 2) {
        recv_cb_cold_7();
LAB_001a8f61:
        recv_cb_cold_5();
LAB_001a8f6e:
        recv_cb_cold_2();
LAB_001a8f7b:
        recv_cb_cold_6();
LAB_001a8f88:
        recv_cb_cold_4();
        goto LAB_001a8f95;
      }
LAB_001a8f12:
      iVar2 = uv_pipe_pending_count(&ctx);
      if (iVar2 < 1) {
        if (recv_cb_count != 2) {
          return;
        }
        uv_close(&ctx,0);
        return;
      }
    }
    if ((long)puVar8 < 0) goto LAB_001a8f7b;
    iVar2 = uv_pipe_pending_count(&ctx);
    if (iVar2 < 1) goto LAB_001a8f6e;
    uVar4 = uv_pipe_pending_type(&ctx);
    if (uVar4 == ctx.expected_type) {
      if (uVar4 == UV_TCP) {
        iVar2 = uv_tcp_init(ctx.channel.loop,uVar5);
      }
      else {
        if (uVar4 != UV_NAMED_PIPE) goto LAB_001a8fa2;
        iVar2 = uv_pipe_init(ctx.channel.loop,uVar5,0);
      }
      if (iVar2 == 0) {
        iVar2 = uv_accept(&ctx,uVar5);
        if (iVar2 != 0) goto LAB_001a8f61;
        goto LAB_001a8f12;
      }
      goto LAB_001a8f88;
    }
LAB_001a8f95:
    recv_cb_cold_3();
LAB_001a8fa2:
    abort();
  }
  recv_cb_cold_1();
  ptStack_4b8 = (test_ctx *)0x1a8fcb;
  puVar10 = puVar9;
  puStack_488 = puVar8;
  free((void *)*extraout_RDX_01);
  auStack_498._0_8_ = puVar9;
  iVar2 = (int)puVar10;
  if ((puVar9 == (undefined8 *)0xfffffffffffff001) || (puVar9 == (undefined8 *)0xffffffffffffff99))
  {
    return;
  }
  alStack_4a8[0] = 0;
  if (-1 < (long)puVar9) {
    if (ptVar12 != (test_ctx *)0x36bc90) goto LAB_001a919e;
    ptStack_4b8 = (test_ctx *)0x1a901c;
    iVar2 = uv_pipe_pending_count(0x36bc90);
    if (iVar2 < 1) {
      return;
    }
    ptVar12 = (test_ctx *)0x36bc90;
    while( true ) {
      read_cb_count = read_cb_count + 1;
      uVar5 = 0x36be40;
      if (read_cb_count == 2) {
        uVar5 = 0x36bd78;
      }
      uVar6 = 0x36c028;
      if (read_cb_count == 2) {
        uVar6 = 0x36bf10;
      }
      ptStack_4b8 = (test_ctx *)0x1a907b;
      iVar2 = uv_pipe_pending_type(0x36bc90);
      if (iVar2 != 7) break;
      ptStack_4b8 = (test_ctx *)0x1a90ab;
      iVar2 = uv_pipe_init(ctx2.channel.loop,uVar6,0);
LAB_001a90ab:
      alStack_4a8[0] = (long)iVar2;
      alStack_4a8[1] = 0;
      if (alStack_4a8[0] != 0) {
LAB_001a917b:
        ptStack_4b8 = (test_ctx *)0x1a918a;
        read_cb_cold_2();
        goto LAB_001a918a;
      }
      ptStack_4b8 = (test_ctx *)0x1a90d6;
      iVar2 = uv_accept(0x36bc90,uVar6);
      alStack_4a8[0] = (long)iVar2;
      alStack_4a8[1] = 0;
      if (alStack_4a8[0] != 0) {
LAB_001a916c:
        ptStack_4b8 = (test_ctx *)0x1a917b;
        read_cb_cold_3();
        goto LAB_001a917b;
      }
      ptStack_4b8 = (test_ctx *)0x1a90ff;
      auVar13 = uv_buf_init(".",1);
      ptStack_4b8 = (test_ctx *)0x1a9122;
      auStack_498 = auVar13;
      iVar2 = uv_write2(uVar5,0x36bc90,auStack_498,1,uVar6,write2_cb);
      alStack_4a8[0] = (long)iVar2;
      alStack_4a8[1] = 0;
      if (alStack_4a8[0] != 0) {
        ptStack_4b8 = (test_ctx *)0x1a916c;
        read_cb_cold_4();
        goto LAB_001a916c;
      }
      ptStack_4b8 = (test_ctx *)0x1a9146;
      iVar2 = uv_pipe_pending_count(0x36bc90);
      if (iVar2 < 1) {
        return;
      }
    }
    if (iVar2 == 0xc) {
      ptStack_4b8 = (test_ctx *)0x1a9098;
      iVar2 = uv_tcp_init(ctx2.channel.loop,uVar6);
      goto LAB_001a90ab;
    }
LAB_001a918a:
    ptStack_4b8 = (test_ctx *)0x1a918f;
    read_cb_cold_5();
  }
  iVar2 = (int)alStack_4a8;
  ptStack_4b8 = (test_ctx *)0x1a919e;
  read_cb_cold_6();
LAB_001a919e:
  ptStack_4b8 = (test_ctx *)write2_cb;
  read_cb_cold_1();
  lStack_4c0 = (long)iVar2;
  ptStack_4b8 = ptVar12;
  if (lStack_4c0 != 0) {
    plVar11 = &lStack_4c0;
    write2_cb_cold_1();
    iVar2 = uv_is_closing();
    if (iVar2 == 0) {
      uv_close(plVar11,0);
      return;
    }
    return;
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(0x36bf10,0);
    uv_close(0x36c028,0);
    uv_close(0x36bc90,0);
    uv_close(&ctx2,0);
    return;
  }
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT_EQ(1, uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT_OK(r);
}